

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_riff_midi.cpp
# Opt level: O3

bool midi_processor::process_riff_midi
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  byte *pbVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  pointer puVar6;
  char *__s;
  long lVar7;
  bool bVar8;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_buffer;
  string field;
  vector<unsigned_char,_std::allocator<unsigned_char>_> midi_file;
  midi_meta_data meta_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  int *local_f0;
  ulong local_e8;
  char *local_e0;
  char *local_d8;
  char local_d0;
  undefined7 uStack_cf;
  midi_container *local_c0;
  midi_meta_data_item local_b8;
  midi_meta_data local_68;
  
  puVar6 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (ulong)*(uint *)(puVar6 + 4);
  local_68.m_bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.m_data.super__Vector_base<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.m_bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_data.super__Vector_base<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_data.super__Vector_base<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = p_out;
  if (uVar11 == 4) {
LAB_00110e26:
    bVar8 = true;
    midi_container::set_extra_meta_data(local_c0,&local_68);
  }
  else {
    if (0xb < *(uint *)(puVar6 + 4)) {
      piVar13 = (int *)(puVar6 + uVar11 + 8);
      piVar9 = (int *)(uVar11 - 4);
      piVar16 = (int *)(puVar6 + 0xc);
      local_f0 = (int *)0x0;
      local_e8 = 0;
      piVar14 = piVar13;
      do {
        uVar4 = piVar16[1];
        piVar10 = (int *)(ulong)uVar4;
        if (piVar9 < piVar10) break;
        cVar3 = (char)*piVar16;
        if (cVar3 == 'D') {
          piVar14 = (int *)0xffffffffffffffff;
          do {
            if (piVar14 == (int *)0x2) goto LAB_00110ff9;
            pbVar1 = (byte *)((char *)((long)piVar16 + 2) + (long)piVar14);
            pcVar2 = (char *)((long)piVar14 + 0x11e255);
            piVar14 = (int *)((long)piVar14 + 1);
          } while ((uint)*pbVar1 == (int)*pcVar2);
          if ((int *)0x2 < piVar14) {
LAB_00110ff9:
            if (piVar16[2] == 1) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_108,(ulong)(uVar4 - 3));
              if (uVar4 != 4) {
                memmove(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,piVar16 + 3,(size_t)(piVar10 + -1))
                ;
              }
              *(undefined1 *)
               ((long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + (ulong)(uVar4 - 4)) = 0;
              piVar14 = (int *)local_108.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
              midi_meta_data_item::midi_meta_data_item
                        (&local_b8,0,"display_name",
                         (char *)local_108.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
              midi_meta_data::add_item(&local_68,&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8.m_value._M_dataplus._M_p != &local_b8.m_value.field_2) {
                operator_delete(local_b8.m_value._M_dataplus._M_p,
                                local_b8.m_value.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8.m_name._M_dataplus._M_p != &local_b8.m_name.field_2) {
                operator_delete(local_b8.m_name._M_dataplus._M_p,
                                local_b8.m_name.field_2._M_allocated_capacity + 1);
              }
            }
            piVar10 = (int *)(ulong)(uVar4 + 8);
          }
          goto LAB_001112ed;
        }
        if (cVar3 == 'L') {
          uVar11 = 0xffffffffffffffff;
          do {
            if (uVar11 == 2) goto LAB_001110f0;
            lVar12 = uVar11 + 2;
            piVar14 = (int *)0x0;
            lVar7 = uVar11 + 2;
            uVar11 = uVar11 + 1;
          } while ((uint)*(byte *)((long)piVar16 + lVar12) == (int)"LIST"[lVar7]);
          if (uVar11 < 3) goto LAB_001112ed;
LAB_001110f0:
          if ((char)piVar16[2] != 'I') break;
          piVar17 = (int *)((char *)((long)piVar16 + (long)piVar10) + 8);
          piVar9 = (int *)0x0;
          do {
            piVar15 = piVar9;
            if (piVar15 == (int *)0x3) goto LAB_00111133;
            piVar14 = piVar15;
            piVar9 = (int *)((long)piVar15 + 1);
          } while ((uint)(byte)((char *)((long)piVar16 + 9))[(long)piVar15] ==
                   (int)*(char *)((long)piVar15 + 0x11e26b));
          if (piVar15 < (int *)0x3) break;
LAB_00111133:
          if ((((ulong)local_f0 & 1) != 0) || (uVar4 < 4)) break;
          piVar14 = (int *)CONCAT71((int7)((ulong)piVar14 >> 8),1);
          local_f0 = piVar14;
          if (piVar10 != (int *)0x4) {
            piVar16 = piVar16 + 3;
            do {
              if ((long)piVar17 - (long)piVar16 < 4) goto LAB_00110e41;
              uVar5 = piVar16[1];
              uVar11 = (ulong)uVar5;
              if ((ulong)((long)piVar17 - (long)piVar16) < (ulong)(uVar5 + 8)) goto LAB_00110e41;
              local_d8 = (char *)0x0;
              local_d0 = '\0';
              local_e0 = &local_d0;
              std::__cxx11::string::
              _M_replace_dispatch<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((string *)&local_e0,&local_d0,&local_d0,piVar16,piVar16 + 1);
              pcVar2 = local_d8;
              lVar12 = 8;
              do {
                if (*piVar16 == **(int **)((long)&__do_global_dtors_aux_fini_array_entry + lVar12))
                {
                  __s = *(char **)((long)riff_tag_mappings[0] + lVar12);
                  strlen(__s);
                  std::__cxx11::string::_M_replace((ulong)&local_e0,0,pcVar2,(ulong)__s);
                  break;
                }
                lVar12 = lVar12 + 0x10;
              } while (lVar12 != 0x148);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_108,(ulong)(uVar5 + 1));
              if (uVar11 != 0) {
                memmove(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,piVar16 + 2,uVar11);
              }
              *(undefined1 *)
               ((long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar11) = 0;
              piVar14 = (int *)local_108.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
              midi_meta_data_item::midi_meta_data_item
                        (&local_b8,0,local_e0,
                         (char *)local_108.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
              midi_meta_data::add_item(&local_68,&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8.m_value._M_dataplus._M_p != &local_b8.m_value.field_2) {
                operator_delete(local_b8.m_value._M_dataplus._M_p,
                                local_b8.m_value.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8.m_name._M_dataplus._M_p != &local_b8.m_name.field_2) {
                operator_delete(local_b8.m_name._M_dataplus._M_p,
                                local_b8.m_name.field_2._M_allocated_capacity + 1);
              }
              piVar16 = (int *)((long)piVar16 + (ulong)(uVar5 + 8));
              if (local_e0 != &local_d0) {
                operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
              }
              piVar16 = (int *)((long)piVar16 + (ulong)((byte)uVar5 & piVar16 != piVar17));
            } while (piVar16 != piVar17);
          }
LAB_001112f0:
          piVar16 = (int *)((ulong)(piVar17 != piVar13 & (byte)uVar4) + (long)piVar17);
          if ((local_e8 & 1) != 0) goto LAB_00111308;
        }
        else {
          if (cVar3 != 'd') {
LAB_001112ed:
            piVar17 = (int *)((long)piVar16 + (long)piVar10);
            goto LAB_001112f0;
          }
          piVar14 = (int *)0xffffffffffffffff;
          do {
            if (piVar14 == (int *)0x2) goto LAB_00110f37;
            pbVar1 = (byte *)((char *)((long)piVar16 + 2) + (long)piVar14);
            piVar9 = piVar14 + 0x47894;
            piVar14 = (int *)((long)piVar14 + 1);
          } while ((uint)*pbVar1 == (int)(char)*piVar9);
          if (piVar14 < (int *)0x3) goto LAB_001112ed;
LAB_00110f37:
          if ((local_e8 & 1) != 0) break;
          local_b8.m_timestamp = 0;
          local_b8.m_name._M_dataplus._M_p = (pointer)0x0;
          local_b8.m_name._M_string_length = 0;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,piVar16 + 2,
                     (char *)((long)piVar16 + (long)piVar10) + 8);
          bVar8 = process_standard_midi
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,
                             local_c0);
          if ((void *)local_b8.m_timestamp != (void *)0x0) {
            operator_delete((void *)local_b8.m_timestamp,
                            local_b8.m_name._M_string_length - local_b8.m_timestamp);
          }
          if (!bVar8) break;
          piVar16 = (int *)((long)piVar16 + (ulong)(uVar4 + 8));
          piVar16 = (int *)((long)piVar16 + (ulong)(piVar16 != piVar13 & (byte)uVar4));
          local_e8 = 1;
          piVar14 = piVar10;
LAB_00111308:
          if (((ulong)local_f0 & 1) != 0) goto LAB_00110e26;
        }
        if (piVar16 == piVar13) goto LAB_00110e26;
        piVar9 = (int *)((long)piVar13 - (long)piVar16);
      } while (7 < (long)piVar9);
    }
LAB_00110e41:
    bVar8 = false;
  }
  if ((int *)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start != (int *)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.m_bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.m_bitmap.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.m_bitmap.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.m_bitmap.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::~vector(&local_68.m_data);
  return bVar8;
}

Assistant:

bool midi_processor::process_riff_midi( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    uint32_t file_size = p_file[ 4 ] | ( p_file[ 5 ] << 8 ) | ( p_file[ 6 ] << 16 ) | ( p_file[ 7 ] << 24 );

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 12;

    std::vector<uint8_t>::const_iterator body_end = p_file.begin() + 8 + file_size;

    bool found_data = false;
    bool found_info = false;

    midi_meta_data meta_data;

    std::vector<uint8_t> extra_buffer;

    while ( it != body_end )
    {
        if ( body_end - it < 8 ) return false;
        uint32_t chunk_size = toInt32LE( it + 4 );
        if ( (unsigned long)(body_end - it) < chunk_size ) return false;
        if ( it_equal( it, "data", 4 ) )
        {
            if ( !found_data )
            {
                std::vector<uint8_t> midi_file;
                midi_file.assign( it + 8, it + 8 + chunk_size );
                if ( !process_standard_midi( midi_file, p_out ) ) return false;
                found_data = true;
            }
            else return false; /*throw exception_io_data( "Multiple RIFF data chunks found" );*/
            it += 8 + chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else if ( it_equal( it, "DISP", 4 ) )
        {
            uint32_t type = toInt32LE( it + 8 );
            if ( type == 1 )
            {
                extra_buffer.resize( chunk_size - 4 + 1 );
                std::copy( it + 12, it + 8 + chunk_size, extra_buffer.begin() );
				extra_buffer[ chunk_size - 4 ] = '\0';
                meta_data.add_item( midi_meta_data_item( 0, "display_name", (const char *) &extra_buffer[0] ) );
            }
            it += 8 + chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else if ( it_equal( it, "LIST", 4 ) )
        {
            std::vector<uint8_t>::const_iterator chunk_end = it + 8 + chunk_size;
            if ( it_equal( it + 8, "INFO", 4 ) )
            {
                if ( !found_info )
                {
                    if ( chunk_end - it < 12 ) return false;
                    it += 12;
                    while ( it != chunk_end )
                    {
                        if ( chunk_end - it < 4 ) return false;
                        uint32_t field_size = toInt32LE( it + 4 );
                        if ( (unsigned long)(chunk_end - it) < 8 + field_size ) return false;
                        std::string field;
                        field.assign( it, it + 4 );
                        for ( unsigned i = 0; i < _countof(riff_tag_mappings); ++i )
                        {
                            if ( !memcmp( &it[0], riff_tag_mappings[ i ][ 0 ], 4 ) )
                            {
                                field = riff_tag_mappings[ i ][ 1 ];
                                break;
                            }
                        }
                        extra_buffer.resize( field_size + 1 );
                        std::copy( it + 8, it + 8 + field_size, extra_buffer.begin() );
						extra_buffer[ field_size ] = '\0';
                        it += 8 + field_size;
                        meta_data.add_item( midi_meta_data_item( 0, field.c_str(), ( const char * ) &extra_buffer[0] ) );
                        if ( field_size & 1 && it != chunk_end ) ++it;
                    }
                    found_info = true;
                }
                else return false; /*throw exception_io_data( "Multiple RIFF LIST INFO chunks found" );*/
            }
            else return false; /* unknown LIST chunk */
            it = chunk_end;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else
        {
            it += chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }

        if ( found_data && found_info ) break;
    }

    p_out.set_extra_meta_data( meta_data );

    return true;
}